

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::growGlobalUniformBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *newTypeList)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer ppVar4;
  bool bVar5;
  _Self local_48;
  TTypeList *local_40;
  _Self local_38;
  iterator it;
  TTypeList *newTypeList_local;
  TString *memberName_local;
  TType *memberType_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  it._M_node = (_Base_ptr)0x0;
  iVar2 = (*memberType->_vptr_TType[10])();
  correctUniform(this,(TQualifier *)CONCAT44(extraout_var,iVar2));
  uVar3 = (*memberType->_vptr_TType[0x25])();
  if ((uVar3 & 1) != 0) {
    local_40 = TType::getStruct(memberType);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
         ::find(&(this->ioTypeMap).
                 super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                ,&local_40);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
         ::end(&(this->ioTypeMap).
                super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              );
    bVar1 = std::operator!=(&local_38,&local_48);
    bVar5 = false;
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
               ::operator->(&local_38);
      bVar5 = (ppVar4->second).uniform != (TTypeList *)0x0;
    }
    if (bVar5) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
               ::operator->(&local_38);
      it._M_node = (_Base_ptr)(ppVar4->second).uniform;
    }
  }
  TParseContextBase::growGlobalUniformBlock
            (&this->super_TParseContextBase,loc,memberType,memberName,(TTypeList *)it._M_node);
  return;
}

Assistant:

void HlslParseContext::growGlobalUniformBlock(const TSourceLoc& loc, TType& memberType, const TString& memberName,
                                              TTypeList* newTypeList)
{
    newTypeList = nullptr;
    correctUniform(memberType.getQualifier());
    if (memberType.isStruct()) {
        auto it = ioTypeMap.find(memberType.getStruct());
        if (it != ioTypeMap.end() && it->second.uniform)
            newTypeList = it->second.uniform;
    }
    TParseContextBase::growGlobalUniformBlock(loc, memberType, memberName, newTypeList);
}